

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O1

wchar_t zip_read_data_none(archive_read *a,void **_buff,size_t *size,int64_t *offset)

{
  char cVar1;
  byte bVar2;
  void *pvVar3;
  bool bVar4;
  wchar_t wVar5;
  uint8_t *data;
  uint8_t *puVar6;
  long lVar7;
  long lVar8;
  ssize_t bytes_avail;
  size_t dsize;
  uint8_t *local_50;
  size_t *local_48;
  void **local_40;
  uint8_t *local_38;
  
  pvVar3 = a->format->data;
  cVar1 = *(char *)((long)pvVar3 + 0x1f98);
  lVar7 = -10;
  if (cVar1 == '\0') {
    lVar7 = 0;
  }
  lVar8 = 10;
  if (cVar1 == '\0') {
    lVar8 = 0;
  }
  local_40 = _buff;
  if ((*(byte *)(*(long *)((long)pvVar3 + 0x70) + 0x7e) & 8) == 0) {
    if (*(long *)((long)pvVar3 + 0x78) == 0) {
      *(undefined1 *)((long)pvVar3 + 0xa2) = 1;
      if (cVar1 == '\0') {
        return L'\0';
      }
      wVar5 = check_authentication_code(a,(void *)0x0);
      if (wVar5 == L'\0') {
        return L'\0';
      }
      return wVar5;
    }
    data = (uint8_t *)__archive_read_ahead(a,1,(ssize_t *)&local_50);
    if ((long)local_50 < 1) {
      archive_set_error(&a->archive,0x54,"Truncated ZIP file data");
      return L'\xffffffe2';
    }
    if ((long)*(uint8_t **)((long)pvVar3 + 0x78) < (long)local_50) {
      local_50 = *(uint8_t **)((long)pvVar3 + 0x78);
    }
    goto LAB_0025cbef;
  }
  local_48 = size;
  data = (uint8_t *)__archive_read_ahead(a,lVar8 + 0x18U,(ssize_t *)&local_50);
  if ((long)local_50 < (long)(lVar8 + 0x18U)) {
    bVar4 = false;
    archive_set_error(&a->archive,0x54,"Truncated ZIP file data");
    puVar6 = (uint8_t *)0xffffffe2;
  }
  else if (((((data[lVar8] == 'P') && (data[lVar8 + 1] == 'K')) && (data[lVar8 + 2] == '\a')) &&
           (data[lVar8 + 3] == '\b')) &&
          (((*(ulong *)((long)pvVar3 + 0x90) == (ulong)*(uint *)(data + lVar8 + 4) ||
            (*(char *)((long)pvVar3 + 0xa0) != '\0')) ||
           ((*(char *)((long)pvVar3 + 0x1f98) != '\0' &&
            (*(int *)(*(long *)((long)pvVar3 + 0x70) + 0x84) == 2)))))) {
    *(undefined1 *)((long)pvVar3 + 0xa2) = 1;
    if (*(char *)((long)pvVar3 + 0x1f98) == '\0') {
LAB_0025cb14:
      puVar6 = (uint8_t *)0x0;
    }
    else {
      wVar5 = check_authentication_code(a,data);
      puVar6 = (uint8_t *)(ulong)(uint)wVar5;
      if (wVar5 == L'\0') goto LAB_0025cb14;
    }
    bVar4 = false;
  }
  else {
    puVar6 = data + lVar8 + 1;
    while (puVar6 < data + (long)(local_50 + -4)) {
      bVar2 = puVar6[3];
      if (bVar2 < 0x4b) {
        if (bVar2 == 7) {
          puVar6 = puVar6 + 1;
        }
        else {
          if (((bVar2 == 8) && (puVar6[2] == '\a')) && ((puVar6[1] == 'K' && (*puVar6 == 'P'))))
          break;
LAB_0025cbc2:
          puVar6 = puVar6 + 4;
        }
      }
      else if (bVar2 == 0x50) {
        puVar6 = puVar6 + 3;
      }
      else {
        if (bVar2 != 0x4b) goto LAB_0025cbc2;
        puVar6 = puVar6 + 2;
      }
    }
    puVar6 = puVar6 + (lVar7 - (long)data);
    bVar4 = true;
    local_50 = puVar6;
  }
  size = local_48;
  if (!bVar4) {
    return (wchar_t)puVar6;
  }
LAB_0025cbef:
  if ((*(char *)((long)pvVar3 + 0x1f2c) != '\0') || (*(char *)((long)pvVar3 + 0x1f88) != '\0')) {
    puVar6 = *(uint8_t **)((long)pvVar3 + 0x1f08);
    if (local_50 < *(uint8_t **)((long)pvVar3 + 0x1f08)) {
      puVar6 = local_50;
    }
    if (*(char *)((long)pvVar3 + 0x1f2c) == '\0') {
      local_38 = puVar6;
      __hmac_sha1_update((archive_hmac_sha1_ctx *)((long)pvVar3 + 0x1f90),data,(size_t)puVar6);
      aes_ctr_update((archive_crypto_ctx *)((long)pvVar3 + 0x1f30),data,(size_t)puVar6,
                     *(uint8_t **)((long)pvVar3 + 0x1ef8),(size_t *)&local_38);
    }
    else {
      trad_enc_decrypt_update
                ((trad_enc_ctx *)((long)pvVar3 + 0x1f20),data,(size_t)puVar6,
                 *(uint8_t **)((long)pvVar3 + 0x1ef8),(size_t)puVar6);
    }
    data = *(uint8_t **)((long)pvVar3 + 0x1ef8);
    local_50 = puVar6;
  }
  *(long *)((long)pvVar3 + 0x78) = *(long *)((long)pvVar3 + 0x78) - (long)local_50;
  *(long *)((long)pvVar3 + 0x88) = (long)(local_50 + *(long *)((long)pvVar3 + 0x88));
  *(long *)((long)pvVar3 + 0x80) = (long)(local_50 + *(long *)((long)pvVar3 + 0x80));
  *(long *)((long)pvVar3 + 0x68) = (long)(local_50 + *(long *)((long)pvVar3 + 0x68));
  *size = (size_t)local_50;
  *local_40 = data;
  return L'\0';
}

Assistant:

static int
zip_read_data_none(struct archive_read *a, const void **_buff,
    size_t *size, int64_t *offset)
{
	struct zip *zip;
	const char *buff;
	ssize_t bytes_avail;
	ssize_t trailing_extra;
	int r;

	(void)offset; /* UNUSED */

	zip = (struct zip *)(a->format->data);
	trailing_extra = zip->hctx_valid ? AUTH_CODE_SIZE : 0;

	if (zip->entry->zip_flags & ZIP_LENGTH_AT_END) {
		const char *p;
		ssize_t grabbing_bytes = 24 + trailing_extra;

		/* Grab at least 24 bytes. */
		buff = __archive_read_ahead(a, grabbing_bytes, &bytes_avail);
		if (bytes_avail < grabbing_bytes) {
			/* Zip archives have end-of-archive markers
			   that are longer than this, so a failure to get at
			   least 24 bytes really does indicate a truncated
			   file. */
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated ZIP file data");
			return (ARCHIVE_FATAL);
		}
		/* Check for a complete PK\007\010 signature, followed
		 * by the correct 4-byte CRC. */
		p = buff + trailing_extra;
		if (p[0] == 'P' && p[1] == 'K'
		    && p[2] == '\007' && p[3] == '\010'
		    && (archive_le32dec(p + 4) == zip->computed_crc32
			|| zip->ignore_crc32
			|| (zip->hctx_valid
			 && zip->entry->aes_extra.vendor == AES_VENDOR_AE_2))) {
			zip->end_of_entry = 1;
			if (zip->hctx_valid) {
				r = check_authentication_code(a, buff);
				if (r != ARCHIVE_OK)
					return (r);
			}
			return (ARCHIVE_OK);
		}
		/* If not at EOF, ensure we consume at least one byte. */
		++p;

		/* Scan forward until we see where a PK\007\010 signature
		 * might be. */
		/* Return bytes up until that point.  On the next call,
		 * the code above will verify the data descriptor. */
		while (p < buff + bytes_avail - 4) {
			if (p[3] == 'P') { p += 3; }
			else if (p[3] == 'K') { p += 2; }
			else if (p[3] == '\007') { p += 1; }
			else if (p[3] == '\010' && p[2] == '\007'
			    && p[1] == 'K' && p[0] == 'P') {
				break;
			} else { p += 4; }
		}
		p -= trailing_extra;
		bytes_avail = p - buff;
	} else {
		if (zip->entry_bytes_remaining == 0) {
			zip->end_of_entry = 1;
			if (zip->hctx_valid) {
				r = check_authentication_code(a, NULL);
				if (r != ARCHIVE_OK)
					return (r);
			}
			return (ARCHIVE_OK);
		}
		/* Grab a bunch of bytes. */
		buff = __archive_read_ahead(a, 1, &bytes_avail);
		if (bytes_avail <= 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated ZIP file data");
			return (ARCHIVE_FATAL);
		}
		if (bytes_avail > zip->entry_bytes_remaining)
			bytes_avail = (ssize_t)zip->entry_bytes_remaining;
	}
	if (zip->tctx_valid || zip->cctx_valid) {
		size_t dec_size = bytes_avail;

		if (dec_size > zip->decrypted_buffer_size)
			dec_size = zip->decrypted_buffer_size;
		if (zip->tctx_valid) {
			trad_enc_decrypt_update(&zip->tctx,
			    (const uint8_t *)buff, dec_size,
			    zip->decrypted_buffer, dec_size);
		} else {
			size_t dsize = dec_size;
			archive_hmac_sha1_update(&zip->hctx,
			    (const uint8_t *)buff, dec_size);
			archive_decrypto_aes_ctr_update(&zip->cctx,
			    (const uint8_t *)buff, dec_size,
			    zip->decrypted_buffer, &dsize);
		}
		bytes_avail = dec_size;
		buff = (const char *)zip->decrypted_buffer;
	}
	zip->entry_bytes_remaining -= bytes_avail;
	zip->entry_uncompressed_bytes_read += bytes_avail;
	zip->entry_compressed_bytes_read += bytes_avail;
	zip->unconsumed += bytes_avail;
	*size = bytes_avail;
	*_buff = buff;
	return (ARCHIVE_OK);
}